

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_show.cpp
# Opt level: O3

unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> __thiscall
duckdb::Transformer::TransformShow(Transformer *this,PGVariableShowStmt *stmt)

{
  TableRef *pTVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *__s;
  char *pcVar3;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var4;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var5;
  _Head_base<0UL,_duckdb::ShowRef_*,_false> _Var6;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> _Var7;
  _Alloc_hider _Var8;
  undefined8 uVar9;
  _Alloc_hider root;
  int iVar10;
  SelectNode *pSVar11;
  pointer pSVar12;
  StarExpression *pSVar13;
  ShowRef *this_00;
  pointer pSVar14;
  long *plVar15;
  undefined8 *puVar16;
  long in_RDX;
  pointer *__ptr;
  string table_name;
  _Head_base<0UL,_duckdb::ShowRef_*,_false> local_a8;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> local_a0;
  string local_98;
  undefined1 local_78 [32];
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_58;
  __node_base local_50;
  _func_int **local_48;
  long lStack_40;
  _Alloc_hider local_38;
  
  pSVar11 = (SelectNode *)operator_new(0xf0);
  SelectNode::SelectNode(pSVar11);
  local_a0._M_head_impl = pSVar11;
  pSVar12 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
            operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                        *)&local_a0);
  local_38._M_p = (pointer)stmt;
  pSVar13 = (StarExpression *)operator_new(0x110);
  pTVar1 = (TableRef *)(local_78 + 0x10);
  local_78._8_8_ = (ParserOptions *)0x0;
  local_78[0x10] = '\0';
  local_78._0_8_ = pTVar1;
  StarExpression::StarExpression(pSVar13,(string *)local_78);
  if ((TableRef *)local_78._0_8_ != pTVar1) {
    operator_delete((void *)local_78._0_8_);
  }
  local_98._M_dataplus._M_p = (pointer)pSVar13;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              *)&pSVar12->select_list,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_98);
  if ((StarExpression *)local_98._M_dataplus._M_p != (StarExpression *)0x0) {
    (**(code **)(*(long *)local_98._M_dataplus._M_p + 8))();
  }
  this_00 = (ShowRef *)operator_new(0x98);
  ShowRef::ShowRef(this_00);
  __s = *(char **)(in_RDX + 0x10);
  local_a8._M_head_impl = this_00;
  if (__s != (char *)0x0) {
    pSVar14 = unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true>::operator->
                        ((unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true> *)
                         &local_a8);
    pcVar3 = (char *)(pSVar14->table_name)._M_string_length;
    strlen(__s);
    ::std::__cxx11::string::_M_replace((ulong)&pSVar14->table_name,0,pcVar3,(ulong)__s);
    goto LAB_00e8c1af;
  }
  if (*(long *)(*(long *)(in_RDX + 8) + 0x10) != 0) goto LAB_00e8c1af;
  ::std::__cxx11::string::string
            ((string *)&local_98,*(char **)(*(long *)(in_RDX + 8) + 0x18),(allocator *)&local_58);
  StringUtil::Lower((string *)local_78,&local_98);
  paVar2 = &local_98.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  iVar10 = ::std::__cxx11::string::compare(local_78);
  if (iVar10 == 0) {
LAB_00e8c0b3:
    plVar15 = (long *)::std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0x1ded75b);
    pSVar13 = (StarExpression *)(plVar15 + 2);
    if ((StarExpression *)*plVar15 == pSVar13) {
      local_48 = (pSVar13->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression;
      lStack_40 = plVar15[3];
      local_58._M_head_impl = (ParsedExpression *)&stack0xffffffffffffffb8;
    }
    else {
      local_48 = (pSVar13->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression;
      local_58._M_head_impl = (ParsedExpression *)*plVar15;
    }
    local_50._M_nxt = (_Hash_node_base *)plVar15[1];
    *plVar15 = (long)pSVar13;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_58);
    pSVar13 = (StarExpression *)(puVar16 + 2);
    if ((StarExpression *)*puVar16 == pSVar13) {
      local_98.field_2._M_allocated_capacity =
           (size_type)(pSVar13->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression;
      local_98.field_2._8_8_ = puVar16[3];
      local_98._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_98.field_2._M_allocated_capacity =
           (size_type)(pSVar13->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression;
      local_98._M_dataplus._M_p = (pointer)*puVar16;
    }
    local_98._M_string_length = puVar16[1];
    *puVar16 = pSVar13;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    pSVar14 = unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true>::operator->
                        ((unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true> *)
                         &local_a8);
    ::std::__cxx11::string::operator=((string *)&pSVar14->table_name,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((StarExpression *)local_58._M_head_impl != (StarExpression *)&stack0xffffffffffffffb8) {
      operator_delete(local_58._M_head_impl);
    }
  }
  else {
    iVar10 = ::std::__cxx11::string::compare(local_78);
    if (iVar10 == 0) goto LAB_00e8c0b3;
    iVar10 = ::std::__cxx11::string::compare(local_78);
    if (iVar10 == 0) goto LAB_00e8c0b3;
  }
  if ((TableRef *)local_78._0_8_ != pTVar1) {
    operator_delete((void *)local_78._0_8_);
  }
LAB_00e8c1af:
  pSVar14 = unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true>::operator->
                      ((unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true> *)
                       &local_a8);
  if ((pSVar14->table_name)._M_string_length == 0) {
    pSVar11 = (SelectNode *)operator_new(0xf0);
    SelectNode::SelectNode(pSVar11);
    local_98._M_dataplus._M_p = (pointer)pSVar11;
    pSVar12 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_98);
    pSVar13 = (StarExpression *)operator_new(0x110);
    local_78._8_8_ = (ParserOptions *)0x0;
    local_78[0x10] = '\0';
    local_78._0_8_ = pTVar1;
    StarExpression::StarExpression(pSVar13,(string *)local_78);
    if ((TableRef *)local_78._0_8_ != pTVar1) {
      operator_delete((void *)local_78._0_8_);
    }
    local_58._M_head_impl = (ParsedExpression *)pSVar13;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pSVar12->select_list,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_58);
    root._M_p = local_38._M_p;
    if ((StarExpression *)local_58._M_head_impl != (StarExpression *)0x0) {
      (*((BaseExpression *)&((local_58._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
        _vptr_BaseExpression[1])();
    }
    TransformRangeVar((Transformer *)local_78,(PGRangeVar *)root._M_p);
    pSVar12 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_98);
    uVar9 = local_78._0_8_;
    local_78._0_8_ = (TableRef *)0x0;
    _Var4._M_head_impl =
         (pSVar12->from_table).
         super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pSVar12->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>
    ._M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)uVar9;
    if (_Var4._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var4._M_head_impl)->_vptr_TableRef + 8))();
    }
    _Var8._M_p = local_98._M_dataplus._M_p;
    local_98._M_dataplus._M_p = (pointer)0x0;
    pSVar14 = unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true>::operator->
                        ((unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true> *)
                         &local_a8);
    _Var5._M_head_impl =
         (pSVar14->query).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pSVar14->query).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)_Var8._M_p;
    if (_Var5._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var5._M_head_impl)->_vptr_QueryNode + 8))();
    }
    if ((TableRef *)local_78._0_8_ != (TableRef *)0x0) {
      (**(code **)(*(long *)local_78._0_8_ + 8))();
    }
    if ((StarExpression *)local_98._M_dataplus._M_p != (StarExpression *)0x0) {
      (**(code **)(*(long *)local_98._M_dataplus._M_p + 8))();
    }
  }
  iVar10 = *(int *)(in_RDX + 0x18);
  pSVar14 = unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true>::operator->
                      ((unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true> *)
                       &local_a8);
  _Var6._M_head_impl = local_a8._M_head_impl;
  pSVar14->show_type = iVar10 == 0;
  local_a8._M_head_impl = (ShowRef *)0x0;
  pSVar12 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
            operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                        *)&local_a0);
  _Var4._M_head_impl =
       (pSVar12->from_table).
       super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  (pSVar12->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
  _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl =
       &(_Var6._M_head_impl)->super_TableRef;
  if (_Var4._M_head_impl != (TableRef *)0x0) {
    (**(code **)((long)(_Var4._M_head_impl)->_vptr_TableRef + 8))();
  }
  _Var7._M_head_impl = local_a0._M_head_impl;
  local_a0._M_head_impl = (SelectNode *)0x0;
  (this->parent).ptr = (Transformer *)_Var7._M_head_impl;
  if (local_a8._M_head_impl != (ShowRef *)0x0) {
    (*((local_a8._M_head_impl)->super_TableRef)._vptr_TableRef[1])();
    if (local_a0._M_head_impl != (SelectNode *)0x0) {
      (*((local_a0._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
    }
  }
  return (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)this;
}

Assistant:

unique_ptr<QueryNode> Transformer::TransformShow(duckdb_libpgquery::PGVariableShowStmt &stmt) {
	// create the query that holds the show statement
	auto select_node = make_uniq<SelectNode>();
	select_node->select_list.push_back(make_uniq<StarExpression>());
	auto showref = make_uniq<ShowRef>();
	if (stmt.set) {
		// describing a set (e.g. SHOW ALL TABLES) - push it in the table name
		showref->table_name = stmt.set;
	} else if (!stmt.relation->schemaname) {
		// describing an unqualified relation - check if this is a "special" relation
		string table_name = StringUtil::Lower(stmt.relation->relname);
		if (table_name == "databases" || table_name == "tables" || table_name == "variables") {
			showref->table_name = "\"" + std::move(table_name) + "\"";
		}
	}
	if (showref->table_name.empty()) {
		// describing a single relation
		// wrap the relation in a "SELECT * FROM [table_name]" query
		auto show_select_node = make_uniq<SelectNode>();
		show_select_node->select_list.push_back(make_uniq<StarExpression>());
		auto tableref = TransformRangeVar(*stmt.relation);
		show_select_node->from_table = std::move(tableref);
		showref->query = std::move(show_select_node);
	}

	showref->show_type = stmt.is_summary ? ShowType::SUMMARY : ShowType::DESCRIBE;
	select_node->from_table = std::move(showref);
	return std::move(select_node);
}